

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

ggml_cgraph * clip_image_build_graph_siglip(clip_ctx *ctx,clip_image_f32_batch *imgs)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __type_conflict _Var5;
  __type_conflict _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_type sVar11;
  uchar *puVar12;
  pointer pgVar13;
  ggml_cgraph *this;
  undefined8 uVar14;
  const_reference pvVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *in_RSI;
  long in_RDI;
  float fVar19;
  int width;
  int height;
  int bsz;
  int seq;
  int n_embd;
  int scale_factor;
  ggml_tensor *cur_1;
  int kernel_size;
  int patches_per_image;
  int tokens_per_side;
  int mm_tokens_per_image;
  int batch_size;
  ggml_tensor *KQV;
  ggml_tensor *KQ;
  ggml_tensor *V;
  ggml_tensor *K;
  ggml_tensor *Q;
  ggml_tensor *cur;
  int il;
  ggml_tensor *embeddings;
  ggml_tensor *inp;
  ggml_tensor *inp_raw;
  ggml_cgraph *gf;
  pointer ctx0;
  ggml_context_ptr ctx0_ptr;
  ggml_init_params params;
  float eps;
  int n_layer;
  int d_head;
  int n_head;
  int hidden_size;
  int num_patches;
  int patch_size;
  int image_size_height;
  int image_size_width;
  int image_size;
  clip_hparams *hparams;
  clip_vision_model *model;
  undefined4 uVar20;
  int local_c4;
  long local_c0;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined7 uStack_4f;
  
  iVar9 = *(int *)(in_RDI + 0x10);
  iVar10 = *(int *)(in_RDI + 0x14);
  iVar7 = (iVar9 / iVar10) * (iVar9 / iVar10);
  iVar2 = *(int *)(in_RDI + 0x18);
  iVar3 = *(int *)(in_RDI + 0x24);
  iVar8 = iVar2 / iVar3;
  iVar4 = *(int *)(in_RDI + 0x28);
  uVar1 = *(undefined4 *)(in_RDI + 0x34);
  sVar11 = std::
           vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
           ::size(in_RSI);
  if (sVar11 != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,0x188,"GGML_ASSERT(%s) failed","imgs.entries.size() == 1");
  }
  sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x338));
  puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17f0f8);
  uVar20 = (undefined4)((uint7)uStack_4f >> 0x18);
  local_88 = (undefined4)sVar11;
  uStack_84 = (undefined4)(sVar11 >> 0x20);
  uStack_80 = SUB84(puVar12,0);
  uStack_7c = (undefined4)((ulong)puVar12 >> 0x20);
  ggml_init();
  std::unique_ptr<ggml_context,ggml_context_deleter>::unique_ptr<ggml_context_deleter,void>
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)CONCAT44(uStack_7c,uStack_80),
             (pointer)CONCAT44(uStack_84,local_88));
  pgVar13 = std::unique_ptr<ggml_context,_ggml_context_deleter>::get
                      ((unique_ptr<ggml_context,_ggml_context_deleter> *)
                       CONCAT44(uStack_7c,uStack_80));
  this = (ggml_cgraph *)ggml_new_graph(pgVar13);
  uVar14 = ggml_new_tensor_3d(pgVar13,0,(long)iVar9,(long)iVar9,3);
  ggml_set_name(uVar14,"inp_raw");
  ggml_set_input(uVar14);
  uVar14 = ggml_conv_2d(pgVar13,*(undefined8 *)(in_RDI + 0xa0),uVar14,iVar10,iVar10,0,0,1,
                        CONCAT44(uVar20,1));
  uVar14 = ggml_reshape_2d(pgVar13,uVar14,(long)iVar7,(long)iVar2);
  uVar14 = ggml_transpose(pgVar13,uVar14);
  uVar14 = ggml_cont(pgVar13,uVar14);
  uVar14 = ggml_add(pgVar13,uVar14,*(undefined8 *)(in_RDI + 0xb0));
  local_c0 = ggml_add(pgVar13,uVar14,*(undefined8 *)(in_RDI + 0xb8));
  for (local_c4 = 0; local_c4 < iVar4; local_c4 = local_c4 + 1) {
    uVar14 = ggml_norm(uVar1,pgVar13,local_c0);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar14 = ggml_mul(pgVar13,uVar14,pvVar15->ln_1_w);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar14 = ggml_add(pgVar13,uVar14,pvVar15->ln_1_b);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar16 = ggml_mul_mat(pgVar13,pvVar15->q_w,uVar14);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar16 = ggml_add(pgVar13,uVar16,pvVar15->q_b);
    uVar16 = ggml_reshape_3d(pgVar13,uVar16,(long)iVar8,(long)iVar3,(long)iVar7);
    uVar16 = ggml_permute(pgVar13,uVar16,0,2,1,3);
    uVar16 = ggml_cont(pgVar13,uVar16);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar17 = ggml_mul_mat(pgVar13,pvVar15->k_w,uVar14);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar17 = ggml_add(pgVar13,uVar17,pvVar15->k_b);
    uVar17 = ggml_reshape_3d(pgVar13,uVar17,(long)iVar8,(long)iVar3,(long)iVar7);
    uVar17 = ggml_permute(pgVar13,uVar17,0,2,1,3);
    uVar17 = ggml_cont(pgVar13,uVar17);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar14 = ggml_mul_mat(pgVar13,pvVar15->v_w,uVar14);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar14 = ggml_add(pgVar13,uVar14,pvVar15->v_b);
    uVar14 = ggml_reshape_3d(pgVar13,uVar14,(long)iVar8,(long)iVar3,(long)iVar7);
    uVar14 = ggml_permute(pgVar13,uVar14,1,2,0,3);
    uVar14 = ggml_cont(pgVar13,uVar14);
    uVar16 = ggml_mul_mat(pgVar13,uVar17,uVar16);
    fVar19 = sqrtf((float)iVar8);
    uVar16 = ggml_soft_max_ext(1.0 / fVar19,pgVar13,uVar16,0);
    uVar14 = ggml_mul_mat(pgVar13,uVar14,uVar16);
    uVar14 = ggml_reshape_3d(pgVar13,uVar14,(long)iVar8,(long)iVar7,(long)iVar3);
    uVar14 = ggml_permute(pgVar13,uVar14,0,2,1,3);
    uVar14 = ggml_cont_2d(pgVar13,uVar14,(long)iVar2,(long)iVar7);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar14 = ggml_mul_mat(pgVar13,pvVar15->o_w,uVar14);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar14 = ggml_add(pgVar13,uVar14,pvVar15->o_b);
    uVar14 = ggml_add(pgVar13,uVar14,local_c0);
    uVar16 = ggml_norm(uVar1,pgVar13,uVar14);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar16 = ggml_mul(pgVar13,uVar16,pvVar15->ln_2_w);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar16 = ggml_add(pgVar13,uVar16,pvVar15->ln_2_b);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar16 = ggml_mul_mat(pgVar13,pvVar15->ff_i_w,uVar16);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar16 = ggml_add(pgVar13,uVar16,pvVar15->ff_i_b);
    uVar16 = ggml_gelu(pgVar13,uVar16);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar16 = ggml_mul_mat(pgVar13,pvVar15->ff_o_w,uVar16);
    pvVar15 = std::vector<clip_layer,_std::allocator<clip_layer>_>::operator[]
                        ((vector<clip_layer,_std::allocator<clip_layer>_> *)(in_RDI + 0xd0),
                         (long)local_c4);
    uVar16 = ggml_add(pgVar13,uVar16,pvVar15->ff_o_b);
    local_c0 = ggml_add(pgVar13,uVar14,uVar16);
  }
  if (*(long *)(in_RDI + 0xe8) != 0) {
    uVar14 = ggml_norm(uVar1,pgVar13,local_c0);
    ggml_set_name(uVar14,"post_ln");
    uVar14 = ggml_mul(pgVar13,uVar14,*(undefined8 *)(in_RDI + 0xe8));
    local_c0 = ggml_add(pgVar13,uVar14,*(undefined8 *)(in_RDI + 0xf0));
  }
  if (*(int *)(in_RDI + 0x300) == 7) {
    _Var5 = std::sqrt<int>(0);
    _Var6 = std::sqrt<int>(0);
    iVar9 = (int)_Var6;
    iVar10 = iVar9 / (int)_Var5;
    uVar14 = ggml_transpose(pgVar13,local_c0,(long)iVar9 % (long)(int)_Var5 & 0xffffffff);
    uVar14 = ggml_cont(pgVar13,uVar14);
    uVar14 = ggml_reshape_4d(pgVar13,uVar14,(long)iVar9,(long)iVar9,(long)iVar2,1);
    lVar18 = ggml_pool_2d(0,pgVar13,uVar14,1,iVar10,iVar10,iVar10,iVar10);
    uVar14 = ggml_reshape_3d(pgVar13,lVar18,*(long *)(lVar18 + 0x10) * *(long *)(lVar18 + 0x10),
                             (long)iVar2,1);
    uVar14 = ggml_transpose(pgVar13,uVar14);
    uVar14 = ggml_cont(pgVar13,uVar14);
    uVar14 = ggml_rms_norm(uVar1,pgVar13,uVar14);
    uVar14 = ggml_mul(pgVar13,uVar14,*(undefined8 *)(in_RDI + 0x2f0));
    uVar16 = ggml_transpose(pgVar13,*(undefined8 *)(in_RDI + 0x2e8));
    uVar16 = ggml_cont(pgVar13,uVar16);
    local_c0 = ggml_mul_mat(pgVar13,uVar16,uVar14);
  }
  else if (*(int *)(in_RDI + 0x300) == 8) {
    iVar9 = *(int *)(in_RDI + 0x2c);
    iVar10 = *(int *)(local_c0 + 0x10);
    iVar2 = *(int *)(local_c0 + 0x18);
    _Var5 = std::sqrt<int>(0);
    _Var6 = std::sqrt<int>(0);
    if (iVar9 == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
                 ,0x212,"GGML_ASSERT(%s) failed","scale_factor != 0");
    }
    uVar14 = ggml_reshape_4d(pgVar13,local_c0,(long)(iVar10 * iVar9),(long)((int)_Var6 / iVar9),
                             (long)(int)_Var5,1);
    uVar14 = ggml_permute(pgVar13,uVar14,0,2,1,3);
    uVar14 = ggml_cont(pgVar13,uVar14);
    uVar14 = ggml_reshape_4d(pgVar13,uVar14,(long)(iVar10 * iVar9 * iVar9),
                             (long)((int)_Var5 / iVar9),(long)((int)_Var6 / iVar9),1);
    uVar14 = ggml_permute(pgVar13,uVar14,0,2,1,3);
    uVar14 = ggml_cont(pgVar13,uVar14);
    uVar14 = ggml_reshape_3d(pgVar13,uVar14,(long)(iVar9 * iVar9 * iVar10),
                             (long)(iVar2 / (iVar9 * iVar9)),1);
    local_c0 = ggml_mul_mat(pgVar13,*(undefined8 *)(in_RDI + 0xf8),uVar14);
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/llava/clip.cpp"
               ,0x223,"SigLIP: Unsupported projector type");
  }
  ggml_build_forward_expand(this,local_c0);
  std::unique_ptr<ggml_context,_ggml_context_deleter>::~unique_ptr
            ((unique_ptr<ggml_context,_ggml_context_deleter> *)this);
  return this;
}

Assistant:

static ggml_cgraph * clip_image_build_graph_siglip(clip_ctx * ctx, const clip_image_f32_batch & imgs) {
    const auto & model = ctx->vision_model;
    const auto & hparams = model.hparams;

    const int image_size = hparams.image_size;
    int image_size_width  = image_size;
    int image_size_height = image_size;

    const int patch_size           = hparams.patch_size;
    const int num_patches          = ((image_size_width / patch_size) * (image_size_height / patch_size));
    const int hidden_size          = hparams.hidden_size;
    const int n_head               = hparams.n_head;
    const int d_head               = hidden_size / n_head;
    const int n_layer              = hparams.n_layer;
    const float eps                = hparams.eps;

    GGML_ASSERT(imgs.entries.size() == 1); // batch_size == 1

    struct ggml_init_params params = {
        /*.mem_size   =*/ ctx->buf_compute_meta.size(),
        /*.mem_buffer =*/ ctx->buf_compute_meta.data(),
        /*.no_alloc   =*/ true,
    };

    ggml_context_ptr ctx0_ptr(ggml_init(params));
    auto ctx0 = ctx0_ptr.get();

    struct ggml_cgraph * gf = ggml_new_graph(ctx0);

    // input raw
    struct ggml_tensor * inp_raw = ggml_new_tensor_3d(ctx0, GGML_TYPE_F32, image_size_width, image_size_height, 3);
    ggml_set_name(inp_raw, "inp_raw");
    ggml_set_input(inp_raw);

    struct ggml_tensor * inp = ggml_conv_2d(ctx0, model.patch_embeddings_0, inp_raw, patch_size, patch_size, 0, 0, 1, 1);
    inp = ggml_reshape_2d(ctx0, inp, num_patches, hidden_size);
    inp = ggml_cont(ctx0, ggml_transpose(ctx0, inp));
    inp = ggml_add(ctx0, inp, model.patch_bias);

    // position embeddings
    struct ggml_tensor * embeddings = ggml_add(ctx0, inp, model.position_embeddings);

    // loop over layers
    for (int il = 0; il < n_layer; il++) {
        struct ggml_tensor * cur = embeddings; // embeddings = residual, cur = hidden_states

        // layernorm1
        {
            cur = ggml_norm(ctx0, cur, eps);
            cur = ggml_add(ctx0, ggml_mul(ctx0, cur, model.layers[il].ln_1_w), model.layers[il].ln_1_b);
        }

        // self-attention
        {

            struct ggml_tensor * Q =
                ggml_add(ctx0, ggml_mul_mat(ctx0, model.layers[il].q_w, cur), model.layers[il].q_b);

            Q = ggml_reshape_3d(ctx0, Q, d_head, n_head, num_patches);
            Q = ggml_cont(ctx0, ggml_permute(ctx0, Q, 0, 2, 1, 3));

            struct ggml_tensor * K =
                ggml_add(ctx0, ggml_mul_mat(ctx0, model.layers[il].k_w, cur), model.layers[il].k_b);

            K = ggml_reshape_3d(ctx0, K, d_head, n_head, num_patches);
            K = ggml_cont(ctx0, ggml_permute(ctx0, K, 0, 2, 1, 3));

            struct ggml_tensor * V =
                ggml_add(ctx0, ggml_mul_mat(ctx0, model.layers[il].v_w, cur), model.layers[il].v_b);

            V = ggml_reshape_3d(ctx0, V, d_head, n_head, num_patches);
            V = ggml_cont(ctx0, ggml_permute(ctx0, V, 1, 2, 0, 3));

            struct ggml_tensor * KQ = ggml_mul_mat(ctx0, K, Q);
            KQ = ggml_soft_max_ext(ctx0, KQ, nullptr, 1.0f / sqrtf((float)d_head), 0.0f);

            struct ggml_tensor * KQV = ggml_mul_mat(ctx0, V, KQ);
            KQV = ggml_reshape_3d(ctx0, KQV, d_head, num_patches, n_head);
            KQV = ggml_permute(ctx0, KQV, 0, 2, 1, 3);

            cur = ggml_cont_2d(ctx0, KQV, hidden_size, num_patches);
        }

        // attention output
        cur = ggml_add(ctx0, ggml_mul_mat(ctx0, model.layers[il].o_w, cur), model.layers[il].o_b);

        // re-add the layer input, e.g., residual
        cur = ggml_add(ctx0, cur, embeddings);

        embeddings = cur; // embeddings = residual, cur = hidden_states

        // layernorm2
        {
            cur = ggml_norm(ctx0, cur, eps);
            cur = ggml_add(ctx0, ggml_mul(ctx0, cur, model.layers[il].ln_2_w), model.layers[il].ln_2_b);
        }

        cur = ggml_mul_mat(ctx0, model.layers[il].ff_i_w, cur);
        cur = ggml_add(ctx0, cur, model.layers[il].ff_i_b);

        // siglip uses gelu
        cur = ggml_gelu(ctx0, cur);

        cur = ggml_mul_mat(ctx0, model.layers[il].ff_o_w, cur);
        cur = ggml_add(ctx0, cur, model.layers[il].ff_o_b);

        // residual 2
        cur = ggml_add(ctx0, embeddings, cur);

        embeddings = cur;
    }

    // post-layernorm
    if (model.post_ln_w) {
        embeddings = ggml_norm(ctx0, embeddings, eps);
        ggml_set_name(embeddings, "post_ln");

        embeddings = ggml_add(ctx0, ggml_mul(ctx0, embeddings, model.post_ln_w), model.post_ln_b);
    }

    if (ctx->proj_type == PROJECTOR_TYPE_GEMMA3) {
        const int batch_size = 1;
        const int mm_tokens_per_image = 256; // default value for gemma3
        const int tokens_per_side = sqrt(mm_tokens_per_image);
        const int patches_per_image = sqrt(num_patches);
        const int kernel_size = patches_per_image / tokens_per_side;

        embeddings = ggml_cont(ctx0, ggml_transpose(ctx0, embeddings));
        embeddings = ggml_reshape_4d(ctx0, embeddings, patches_per_image, patches_per_image, hidden_size, batch_size);

        // doing a pool2d to reduce the number of output tokens to 256
        embeddings = ggml_pool_2d(ctx0, embeddings, GGML_OP_POOL_AVG, kernel_size, kernel_size, kernel_size, kernel_size, 0, 0);
        embeddings = ggml_reshape_3d(ctx0, embeddings, embeddings->ne[0] * embeddings->ne[0], hidden_size, batch_size);
        embeddings = ggml_cont(ctx0, ggml_transpose(ctx0, embeddings));

        // apply norm before projection
        embeddings = ggml_rms_norm(ctx0, embeddings, eps);
        embeddings = ggml_mul(ctx0, embeddings, model.mm_soft_emb_norm_w);

        // apply projection
        embeddings = ggml_mul_mat(ctx0,
            ggml_cont(ctx0, ggml_transpose(ctx0, model.mm_input_proj_w)),
            embeddings);

    } else if (ctx->proj_type == PROJECTOR_TYPE_IDEFICS3) {
        // https://github.com/huggingface/transformers/blob/0a950e0bbe1ed58d5401a6b547af19f15f0c195e/src/transformers/models/idefics3/modeling_idefics3.py#L578

        ggml_tensor * cur = embeddings;
        const int scale_factor = model.hparams.proj_scale_factor;
        const int n_embd = cur->ne[0];
        const int seq    = cur->ne[1];
        const int bsz    = 1; // batch size, always 1 for now since we don't support batching
        const int height = std::sqrt(seq);
        const int width  = std::sqrt(seq);
        GGML_ASSERT(scale_factor != 0);
        cur = ggml_reshape_4d(ctx0, cur, n_embd * scale_factor, width / scale_factor, height, bsz);
        cur = ggml_permute(ctx0, cur, 0, 2, 1, 3);
        cur = ggml_reshape_4d(ctx0, ggml_cont(ctx0, cur),
            n_embd * scale_factor * scale_factor,
            height / scale_factor,
            width / scale_factor,
            bsz);
        cur = ggml_permute(ctx0, cur, 0, 2, 1, 3);
        cur = ggml_reshape_3d(ctx0, ggml_cont(ctx0, cur),
            n_embd * scale_factor * scale_factor,
            seq / (scale_factor * scale_factor),
            bsz);

        cur = ggml_mul_mat(ctx0, model.projection, cur);
        embeddings = cur;
    } else {
        GGML_ABORT("SigLIP: Unsupported projector type");
    }

    // build the graph
    ggml_build_forward_expand(gf, embeddings);

    return gf;
}